

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

ExprP<vkt::shaderexecutor::Void> * vkt::shaderexecutor::voidP(void)

{
  int iVar1;
  Expr<vkt::shaderexecutor::Void> *ptr;
  
  if (voidP()::singleton == '\0') {
    iVar1 = __cxa_guard_acquire(&voidP()::singleton);
    if (iVar1 != 0) {
      ptr = (Expr<vkt::shaderexecutor::Void> *)operator_new(0x10);
      (ptr->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00d412a0;
      exprP<vkt::shaderexecutor::Void>((shaderexecutor *)&voidP::singleton,ptr);
      __cxa_atexit(de::SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>::
                   ~SharedPtr,&voidP::singleton,&__dso_handle);
      __cxa_guard_release(&voidP()::singleton);
    }
  }
  return &voidP::singleton;
}

Assistant:

const ExprP<Void>& voidP (void)
{
	static const ExprP<Void> singleton = constant(Void());

	return singleton;
}